

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseData<QSharedPointer<Data>>::resolve<QSharedPointer<Data>const&>
          (PromiseData<QSharedPointer<Data>> *this,QSharedPointer<Data> *value)

{
  PromiseValue<QSharedPointer<Data>_> local_28;
  QSharedPointer<Data> *local_18;
  QSharedPointer<Data> *value_local;
  PromiseData<QSharedPointer<Data>_> *this_local;
  
  local_18 = value;
  value_local = (QSharedPointer<Data> *)this;
  PromiseValue<QSharedPointer<Data>_>::PromiseValue(&local_28,value);
  PromiseValue<QSharedPointer<Data>_>::operator=
            ((PromiseValue<QSharedPointer<Data>_> *)(this + 0x58),&local_28);
  PromiseValue<QSharedPointer<Data>_>::~PromiseValue(&local_28);
  PromiseDataBase<QSharedPointer<Data>,_void_(const_QSharedPointer<Data>_&)>::setSettled
            ((PromiseDataBase<QSharedPointer<Data>,_void_(const_QSharedPointer<Data>_&)> *)this);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }